

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O2

bool __thiscall
cell_comparer_t::operator()
          (cell_comparer_t *this,directed_flag_complex_cell_t *lhs,directed_flag_complex_cell_t *rhs
          )

{
  unsigned_short uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  ushort uVar5;
  
  uVar1 = cell_hasher_t::dimension;
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    if (uVar1 < uVar5) break;
    iVar3 = (**lhs->_vptr_directed_flag_complex_cell_t)(lhs,(ulong)uVar5);
    iVar4 = (**rhs->_vptr_directed_flag_complex_cell_t)(rhs,(ulong)uVar5);
    uVar2 = uVar5 + 1;
  } while ((short)iVar3 == (short)iVar4);
  return uVar1 < uVar5;
}

Assistant:

bool operator()(const directed_flag_complex_cell_t& lhs, const directed_flag_complex_cell_t& rhs) const {
		// Always at most one of the two is a coboundary cell
		const directed_flag_complex_cell_t* l = &lhs;
		const directed_flag_complex_cell_t* r = &rhs;
#ifdef USE_CELLS_WITHOUT_DIMENSION
		unsigned short dimension = cell_hasher_t::dimension;
#else
		assert(l->dimension() == r->dimension());
		unsigned short dimension = l->dimension();
#endif
		for (unsigned short index = 0; index < dimension + 1; index++) {
			if (l->vertex(index) != r->vertex(index)) return false;
		}

		return true;
	}